

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void comparison(Vm *vm)

{
  _Bool _Var1;
  _Bool local_11;
  Vm *vm_local;
  
  arith_expr(vm);
  while( true ) {
    _Var1 = match(vm,TOKEN_SMALLER);
    local_11 = true;
    if (!_Var1) {
      _Var1 = match(vm,TOKEN_SMALLER_EQUALS);
      local_11 = true;
      if (!_Var1) {
        _Var1 = match(vm,TOKEN_GREATER);
        local_11 = true;
        if (!_Var1) {
          local_11 = match(vm,TOKEN_GREATER_EQUALS);
        }
      }
    }
    if (local_11 == false) break;
    switch((vm->compiler).previous.type) {
    case TOKEN_SMALLER:
      arith_expr(vm);
      emit_no_arg(vm,OP_LT);
      break;
    case TOKEN_GREATER:
      arith_expr(vm);
      emit_no_arg(vm,OP_GT);
      break;
    case TOKEN_SMALLER_EQUALS:
      arith_expr(vm);
      emit_no_arg(vm,OP_LE);
      break;
    case TOKEN_GREATER_EQUALS:
      arith_expr(vm);
      emit_no_arg(vm,OP_GE);
    }
  }
  return;
}

Assistant:

static void comparison(Vm *vm) {
    arith_expr(vm);

    while (match(vm, TOKEN_SMALLER) || match(vm, TOKEN_SMALLER_EQUALS)
           || match(vm, TOKEN_GREATER) || match(vm, TOKEN_GREATER_EQUALS)) {
        switch (vm->compiler.previous.type) {
            case TOKEN_SMALLER:
                arith_expr(vm);
                emit_no_arg(vm, OP_LT);
                break;
            case TOKEN_SMALLER_EQUALS:
                arith_expr(vm);
                emit_no_arg(vm, OP_LE);
                break;
            case TOKEN_GREATER:
                arith_expr(vm);
                emit_no_arg(vm, OP_GT);
                break;
            case TOKEN_GREATER_EQUALS:
                arith_expr(vm);
                emit_no_arg(vm, OP_GE);
                break;
            default:
                break;
        }
    }
}